

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterStartDocument
              (xmlTextWriterPtr writer,char *version,char *encoding,char *standalone)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlLinkPtr lk;
  void *pvVar6;
  xmlCharEncodingHandlerPtr pxVar7;
  xmlBufPtr pxVar8;
  xmlChar *pxVar9;
  char *pcVar10;
  xmlParserErrors error;
  char *str;
  xmlOutputBufferPtr pxVar11;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x19,1,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s","xmlTextWriterStartDocument : invalid writer!\n");
    return -1;
  }
  if (writer->out == (xmlOutputBufferPtr)0x0) {
    pcVar10 = "xmlTextWriterStartDocument : invalid writer!\n";
  }
  else {
    lk = xmlListFront(writer->nodes);
    if ((lk == (xmlLinkPtr)0x0) || (pvVar6 = xmlLinkGetData(lk), pvVar6 == (void *)0x0)) {
      if (encoding == (char *)0x0) {
        pxVar11 = writer->out;
        pxVar11->encoder = (xmlCharEncodingHandlerPtr)0x0;
        pxVar11->conv = (xmlBufPtr)0x0;
LAB_001d0d37:
        iVar1 = xmlOutputBufferWriteString(writer->out,"<?xml version=");
        if (iVar1 < 0) {
          return -1;
        }
        pcVar10 = &writer->qchar;
        iVar2 = xmlOutputBufferWrite(writer->out,1,pcVar10);
        if (iVar2 < 0) {
          return -1;
        }
        str = "1.0";
        if (version != (char *)0x0) {
          str = version;
        }
        iVar3 = xmlOutputBufferWriteString(writer->out,str);
        if (iVar3 < 0) {
          return -1;
        }
        iVar4 = xmlOutputBufferWrite(writer->out,1,pcVar10);
        if (iVar4 < 0) {
          return -1;
        }
        iVar4 = iVar2 + iVar1 + iVar3 + iVar4;
        pxVar11 = writer->out;
        if (pxVar11->encoder != (xmlCharEncodingHandlerPtr)0x0) {
          iVar1 = xmlOutputBufferWriteString(pxVar11," encoding=");
          if (iVar1 < 0) {
            return -1;
          }
          iVar2 = xmlOutputBufferWrite(writer->out,1,pcVar10);
          if (iVar2 < 0) {
            return -1;
          }
          iVar3 = xmlOutputBufferWriteString(writer->out,writer->out->encoder->name);
          if (iVar3 < 0) {
            return -1;
          }
          iVar5 = xmlOutputBufferWrite(writer->out,1,pcVar10);
          if (iVar5 < 0) {
            return -1;
          }
          iVar4 = iVar1 + iVar4 + iVar2 + iVar5 + iVar3;
          pxVar11 = writer->out;
        }
        if (standalone != (char *)0x0) {
          iVar1 = xmlOutputBufferWriteString(pxVar11," standalone=");
          if (iVar1 < 0) {
            return -1;
          }
          iVar2 = xmlOutputBufferWrite(writer->out,1,pcVar10);
          if (iVar2 < 0) {
            return -1;
          }
          iVar3 = xmlOutputBufferWriteString(writer->out,standalone);
          if (iVar3 < 0) {
            return -1;
          }
          iVar5 = xmlOutputBufferWrite(writer->out,1,pcVar10);
          if (iVar5 < 0) {
            return -1;
          }
          iVar4 = iVar2 + iVar3 + iVar5 + iVar1 + iVar4;
          pxVar11 = writer->out;
        }
        iVar1 = xmlOutputBufferWriteString(pxVar11,"?>\n");
        if (-1 < iVar1) {
          return iVar1 + iVar4;
        }
        return -1;
      }
      pxVar7 = xmlFindCharEncodingHandler(encoding);
      if (pxVar7 != (xmlCharEncodingHandlerPtr)0x0) {
        pxVar11 = writer->out;
        pxVar11->encoder = pxVar7;
        if (pxVar11->conv == (xmlBufPtr)0x0) {
          pxVar8 = xmlBufCreateSize(4000);
          pxVar11 = writer->out;
          pxVar11->conv = pxVar8;
        }
        xmlCharEncOutput(pxVar11,1);
        if ((writer->doc != (xmlDocPtr)0x0) && (writer->doc->encoding == (xmlChar *)0x0)) {
          pxVar9 = xmlStrdup((xmlChar *)writer->out->encoder->name);
          writer->doc->encoding = pxVar9;
        }
        goto LAB_001d0d37;
      }
      pcVar10 = "xmlTextWriterStartDocument : unsupported encoding\n";
      error = XML_ERR_UNSUPPORTED_ENCODING;
      goto LAB_001d0d0f;
    }
    pcVar10 = "xmlTextWriterStartDocument : not allowed in this context!\n";
  }
  error = XML_ERR_INTERNAL_ERROR;
LAB_001d0d0f:
  xmlWriterErrMsg(writer,error,pcVar10);
  return -1;
}

Assistant:

int
xmlTextWriterStartDocument(xmlTextWriterPtr writer, const char *version,
                           const char *encoding, const char *standalone)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlCharEncodingHandlerPtr encoder;

    if ((writer == NULL) || (writer->out == NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDocument : invalid writer!\n");
        return -1;
    }

    lk = xmlListFront(writer->nodes);
    if ((lk != NULL) && (xmlLinkGetData(lk) != NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDocument : not allowed in this context!\n");
        return -1;
    }

    encoder = NULL;
    if (encoding != NULL) {
        encoder = xmlFindCharEncodingHandler(encoding);
        if (encoder == NULL) {
            xmlWriterErrMsg(writer, XML_ERR_UNSUPPORTED_ENCODING,
                            "xmlTextWriterStartDocument : unsupported encoding\n");
            return -1;
        }
    }

    writer->out->encoder = encoder;
    if (encoder != NULL) {
	if (writer->out->conv == NULL) {
	    writer->out->conv = xmlBufCreateSize(4000);
	}
        xmlCharEncOutput(writer->out, 1);
        if ((writer->doc != NULL) && (writer->doc->encoding == NULL))
            writer->doc->encoding = xmlStrdup((xmlChar *)writer->out->encoder->name);
    } else
        writer->out->conv = NULL;

    sum = 0;
    count = xmlOutputBufferWriteString(writer->out, "<?xml version=");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
    if (count < 0)
        return -1;
    sum += count;
    if (version != 0)
        count = xmlOutputBufferWriteString(writer->out, version);
    else
        count = xmlOutputBufferWriteString(writer->out, "1.0");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
    if (count < 0)
        return -1;
    sum += count;
    if (writer->out->encoder != 0) {
        count = xmlOutputBufferWriteString(writer->out, " encoding=");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count =
            xmlOutputBufferWriteString(writer->out,
                                       writer->out->encoder->name);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (standalone != 0) {
        count = xmlOutputBufferWriteString(writer->out, " standalone=");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWriteString(writer->out, standalone);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "?>\n");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}